

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::keyReleaseEvent(QLineEdit *this,QKeyEvent *e)

{
  long lVar1;
  QWidget *this_00;
  bool bVar2;
  QStyle *pQVar3;
  QLineEditPrivate *d;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(byte *)(*(long *)(lVar1 + 600) + 0x50) & 4) == 0) {
    this_00 = *(QWidget **)(lVar1 + 8);
    bVar2 = QApplication::autoSipEnabled(QCoreApplication::self);
    if (bVar2) {
      pQVar3 = QWidget::style(this_00);
      (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x5f,0,this_00,0);
      QGuiApplication::inputMethod();
      QInputMethod::show();
    }
  }
  QWidgetLineControl::updateCursorBlinking(*(QWidgetLineControl **)(lVar1 + 600));
  QWidget::keyReleaseEvent(&this->super_QWidget,e);
  return;
}

Assistant:

void QLineEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QLineEdit);
    if (!isReadOnly())
        d->handleSoftwareInputPanel();
    d->control->updateCursorBlinking();
    QWidget::keyReleaseEvent(e);
}